

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

bool __thiscall NJamSpell::TSpellCorrector::LoadLangModel(TSpellCorrector *this,string *modelFile)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_48 [8];
  string cacheFile;
  
  bVar1 = TLangModel::Load(&this->LangModel,modelFile);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   modelFile,".spell");
    bVar2 = LoadCache(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
    if (!bVar2) {
      PrepareCache(this);
      SaveCache(this,(string *)local_48);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return bVar1;
}

Assistant:

bool TSpellCorrector::LoadLangModel(const std::string& modelFile) {
    if (!LangModel.Load(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!LoadCache(cacheFile)) {
        PrepareCache();
        SaveCache(cacheFile);
    }
    return true;
}